

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_>::flattenTo
          (Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *this,char *target)

{
  bool bVar1;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *pDVar2;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *elem;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *__end0;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *__begin0;
  Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_> *__range3;
  char *pcStack_18;
  bool first;
  char *target_local;
  Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *this_local;
  
  ensureStringifiedInitialized(this);
  bVar1 = true;
  __end0 = Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_>::begin(&this->stringified);
  pDVar2 = Array<kj::_::Delimited<kj::ArrayPtr<const_unsigned_char>_>_>::end(&this->stringified);
  pcStack_18 = target;
  for (; __end0 != pDVar2; __end0 = __end0 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      pcStack_18 = fill<kj::StringPtr>(pcStack_18,&this->delimiter);
    }
    pcStack_18 = fill<kj::ArrayPtr<unsigned_char_const>>(pcStack_18,__end0);
  }
  return pcStack_18;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }